

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
write_tile_chunk(exr_context_t ctxt,int part_index,exr_priv_part_t part,int tilex,int tiley,
                int levelx,int levely,void *packed_data,uint64_t packed_size,uint64_t unpacked_size,
                void *sample_data,uint64_t sample_data_size)

{
  int tilex_00;
  undefined4 in_ECX;
  int n;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  long in_stack_00000010;
  uint64_t chunkoff;
  int64_t ddata [3];
  uint64_t *ctable;
  int wrcnt;
  int cidx;
  int32_t psize;
  int32_t data [6];
  exr_result_t rv;
  undefined1 *puVar1;
  undefined8 local_90;
  undefined1 local_88 [24];
  void *local_70;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint uVar2;
  int iVar3;
  exr_const_context_t_conflict in_stack_ffffffffffffffa8;
  exr_const_context_t_conflict in_stack_ffffffffffffffb0;
  int local_38;
  exr_result_t local_c;
  
  if (*in_RDI == '\x03') {
    if ((*(int *)(in_RDX + 4) == 0) || (*(int *)(in_RDX + 4) == 2)) {
      local_c = (**(code **)(in_RDI + 0x38))(in_RDI,0x13);
    }
    else if (*(int *)(in_RDI + 0xb8) == in_ESI) {
      if ((in_stack_00000010 == 0) || (chunkoff == 0)) {
        local_c = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"Invalid packed data argument size %lu pointer %p",chunkoff,
                             in_stack_00000010);
      }
      else if ((*(int *)(in_RDX + 4) == 3) || (chunkoff < 0x80000000)) {
        tilex_00 = (int)chunkoff;
        if ((*(int *)(in_RDX + 4) == 3) && ((ddata[1] == 0 || (ddata[2] == 0)))) {
          local_c = (**(code **)(in_RDI + 0x48))
                              (in_RDI,3,"Invalid sample count data argument size %lu pointer %p",
                               ddata[2],ddata[1]);
        }
        else {
          iVar3 = -1;
          puVar1 = &stack0xffffffffffffffa0;
          local_c = validate_and_compute_tile_chunk_off
                              (in_stack_ffffffffffffffb0,
                               (exr_const_priv_part_t)in_stack_ffffffffffffffa8,tilex_00,-1,
                               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                               (int32_t *)CONCAT44(in_ECX,in_R8D));
          if (local_c == 0) {
            if ((iVar3 < 0) || (*(int *)(in_RDX + 0xf4) <= iVar3)) {
              local_c = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,3,
                                   "Chunk index for tile (%d, %d) at level (%d, %d) %d outside chunk count %d"
                                   ,in_ECX,in_R8D,in_R9D,in_stack_00000008,iVar3,
                                   *(undefined4 *)(in_RDX + 0xf4));
            }
            else if ((*(int *)(in_RDX + 0xb4) == 2) || (*(int *)(in_RDI + 0xbc) == iVar3 + -1)) {
              if (in_RDI[5] != '\0') {
              }
              uVar2 = (uint)(in_RDI[5] != '\0');
              *(undefined4 *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 4) = in_ECX;
              *(undefined4 *)(&stack0xffffffffffffffa8 + (long)(int)(uVar2 + 1) * 4) = in_R8D;
              *(undefined4 *)(&stack0xffffffffffffffa8 + (long)(int)(uVar2 + 2) * 4) = in_R9D;
              *(undefined4 *)(&stack0xffffffffffffffa8 + (long)(int)(uVar2 + 3) * 4) =
                   in_stack_00000008;
              n = uVar2 + 4;
              if (*(int *)(in_RDX + 4) != 3) {
                n = uVar2 + 5;
                *(int *)(&stack0xffffffffffffffa8 + (long)(int)(uVar2 + 4) * 4) = tilex_00;
              }
              priv_from_native32(&stack0xffffffffffffffa8,n);
              local_c = alloc_chunk_table(in_stack_ffffffffffffffa8,
                                          (exr_const_priv_part_t)CONCAT44(tilex_00,iVar3),
                                          (uint64_t **)CONCAT44(n,in_stack_ffffffffffffff98));
              if (local_c == 0) {
                *(undefined8 *)((long)local_70 + (long)iVar3 * 8) = *(undefined8 *)(in_RDI + 0xb0);
                local_38 = (**(code **)(in_RDI + 0x30))
                                     (in_RDI,&stack0xffffffffffffffa8,(long)n << 2,in_RDI + 0xb0);
                if ((local_38 == 0) && (*(int *)(in_RDX + 4) == 3)) {
                  priv_from_native64(local_88,3);
                  local_38 = (**(code **)(in_RDI + 0x30))(in_RDI,local_88,0x18,in_RDI + 0xb0);
                  if (local_38 == 0) {
                    local_38 = (**(code **)(in_RDI + 0x30))(in_RDI,ddata[1],ddata[2],in_RDI + 0xb0);
                  }
                }
                if (local_38 == 0) {
                  local_38 = (**(code **)(in_RDI + 0x30))
                                       (in_RDI,in_stack_00000010,chunkoff,in_RDI + 0xb0);
                }
                if (local_38 == 0) {
                  *(int *)(in_RDI + 0xc0) = *(int *)(in_RDI + 0xc0) + 1;
                  if (*(int *)(in_RDI + 0xc0) == *(int *)(in_RDX + 0xf4)) {
                    local_90 = *(undefined8 *)(in_RDX + 0xf8);
                    *(int *)(in_RDI + 0xb8) = *(int *)(in_RDI + 0xb8) + 1;
                    if (*(int *)(in_RDI + 0xb8) == *(int *)(in_RDI + 0xc4)) {
                      *in_RDI = '\x05';
                    }
                    in_RDI[0xbc] = -1;
                    in_RDI[0xbd] = -1;
                    in_RDI[0xbe] = -1;
                    in_RDI[0xbf] = -1;
                    in_RDI[0xc0] = '\0';
                    in_RDI[0xc1] = '\0';
                    in_RDI[0xc2] = '\0';
                    in_RDI[0xc3] = '\0';
                    priv_from_native64(local_70,*(int *)(in_RDX + 0xf4));
                    local_38 = (**(code **)(in_RDI + 0x30))
                                         (in_RDI,local_70,(long)*(int *)(in_RDX + 0xf4) << 3,
                                          &local_90);
                    priv_to_native64(local_70,*(int *)(in_RDX + 0xf4));
                  }
                  else {
                    *(int *)(in_RDI + 0xbc) = iVar3;
                  }
                }
                local_c = local_38;
              }
            }
            else {
              local_c = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,0x1a,
                                   "Chunk index %d is not the next chunk to be written (last %d)",
                                   iVar3,*(undefined4 *)(in_RDI + 0xbc),*(code **)(in_RDI + 0x48),
                                   puVar1);
            }
          }
        }
      }
      else {
        local_c = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"Packed data size %lu too large (max %lu)",chunkoff,0x7fffffff
                            );
      }
    }
    else {
      local_c = (**(code **)(in_RDI + 0x38))(in_RDI,0x19);
    }
  }
  else if (*in_RDI == '\x01') {
    local_c = (**(code **)(in_RDI + 0x38))(in_RDI,9);
  }
  else {
    local_c = (**(code **)(in_RDI + 0x38))(in_RDI,8);
  }
  return local_c;
}

Assistant:

static exr_result_t
write_tile_chunk (
    exr_context_t   ctxt,
    int             part_index,
    exr_priv_part_t part,
    int             tilex,
    int             tiley,
    int             levelx,
    int             levely,
    const void*     packed_data,
    uint64_t        packed_size,
    uint64_t        unpacked_size,
    const void*     sample_data,
    uint64_t        sample_data_size)
{
    exr_result_t rv;
    int32_t      data[6];
    int32_t      psize;
    int          cidx, wrcnt;
    uint64_t*    ctable;

    if (ctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (ctxt->mode == EXR_CONTEXT_WRITE)
            return ctxt->standard_error (ctxt, EXR_ERR_HEADER_NOT_WRITTEN);
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE);
    }

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        return ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI);
    }

    if (ctxt->cur_output_part != part_index)
        return ctxt->standard_error (ctxt, EXR_ERR_INCORRECT_PART);

    if (!packed_data || packed_size == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid packed data argument size %" PRIu64 " pointer %p",
            (uint64_t) packed_size,
            packed_data);

    if (part->storage_mode != EXR_STORAGE_DEEP_TILED &&
        packed_size > (uint64_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Packed data size %" PRIu64 " too large (max %" PRIu64 ")",
            (uint64_t) packed_size,
            (uint64_t) INT32_MAX);
    psize = (int32_t) packed_size;

    if (part->storage_mode == EXR_STORAGE_DEEP_TILED &&
        (!sample_data || sample_data_size == 0))
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid sample count data argument size %" PRIu64 " pointer %p",
            (uint64_t) sample_data_size,
            sample_data);

    cidx = -1;
    rv   = validate_and_compute_tile_chunk_off (
        ctxt, part, tilex, tiley, levelx, levely, &cidx);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Chunk index for tile (%d, %d) at level (%d, %d) %d outside chunk count %d",
            tilex,
            tiley,
            levelx,
            levely,
            cidx,
            part->chunk_count);
    }

    if (part->lineorder != EXR_LINEORDER_RANDOM_Y &&
        ctxt->last_output_chunk != (cidx - 1))
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INCORRECT_CHUNK,
            "Chunk index %d is not the next chunk to be written (last %d)",
            cidx,
            ctxt->last_output_chunk);
    }

    wrcnt = 0;
    if (ctxt->is_multipart) { data[wrcnt++] = part_index; }
    data[wrcnt++] = tilex;
    data[wrcnt++] = tiley;
    data[wrcnt++] = levelx;
    data[wrcnt++] = levely;
    if (part->storage_mode != EXR_STORAGE_DEEP_TILED) data[wrcnt++] = psize;

    priv_from_native32 (data, wrcnt);

    rv = alloc_chunk_table (ctxt, part, &ctable);
    if (rv != EXR_ERR_SUCCESS) return rv;

    ctable[cidx] = ctxt->output_file_offset;
    rv           = ctxt->do_write (
        ctxt,
        data,
        (uint64_t) (wrcnt) * sizeof (int32_t),
        &(ctxt->output_file_offset));
    if (rv == EXR_ERR_SUCCESS && part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        int64_t ddata[3];
        ddata[0] = (int64_t) sample_data_size;
        ddata[1] = (int64_t) packed_size;
        ddata[2] = (int64_t) unpacked_size;

        priv_from_native64 (ddata, 3);

        rv = ctxt->do_write (
            ctxt, ddata, 3 * sizeof (uint64_t), &(ctxt->output_file_offset));

        if (rv == EXR_ERR_SUCCESS)
            rv = ctxt->do_write (
                ctxt,
                sample_data,
                sample_data_size,
                &(ctxt->output_file_offset));
    }
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt, packed_data, packed_size, &(ctxt->output_file_offset));

    if (rv == EXR_ERR_SUCCESS)
    {
        ++(ctxt->output_chunk_count);
        if (ctxt->output_chunk_count == part->chunk_count)
        {
            uint64_t chunkoff = part->chunk_table_offset;

            ++(ctxt->cur_output_part);
            if (ctxt->cur_output_part == ctxt->num_parts)
                ctxt->mode = EXR_CONTEXT_WRITE_FINISHED;
            ctxt->last_output_chunk  = -1;
            ctxt->output_chunk_count = 0;

            priv_from_native64 (ctable, part->chunk_count);
            rv = ctxt->do_write (
                ctxt,
                ctable,
                sizeof (uint64_t) * (uint64_t) (part->chunk_count),
                &chunkoff);
            /* just in case we look at it again? */
            priv_to_native64 (ctable, part->chunk_count);
        }
        else { ctxt->last_output_chunk = cidx; }
    }

    return rv;
}